

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_deriveBlockSplits(ZSTD_CCtx *zc,U32 *partitions,U32 nbSeq)

{
  uint in_EDX;
  uint *in_RSI;
  seqStore_t *unaff_retaddr;
  seqStoreSplits splits;
  undefined4 in_stack_00000018;
  
  if (4 < in_EDX) {
    ZSTD_deriveBlockSplitsHelper
              ((seqStoreSplits *)partitions,CONCAT44(nbSeq,in_stack_00000018),splits.idx,
               (ZSTD_CCtx *)splits.splitLocations,unaff_retaddr);
    *in_RSI = in_EDX;
  }
  return 0;
}

Assistant:

static size_t ZSTD_deriveBlockSplits(ZSTD_CCtx* zc, U32 partitions[], U32 nbSeq)
{
    seqStoreSplits splits;
    splits.splitLocations = partitions;
    splits.idx = 0;
    if (nbSeq <= 4) {
        DEBUGLOG(5, "ZSTD_deriveBlockSplits: Too few sequences to split (%u <= 4)", nbSeq);
        /* Refuse to try and split anything with less than 4 sequences */
        return 0;
    }
    ZSTD_deriveBlockSplitsHelper(&splits, 0, nbSeq, zc, &zc->seqStore);
    splits.splitLocations[splits.idx] = nbSeq;
    DEBUGLOG(5, "ZSTD_deriveBlockSplits: final nb partitions: %zu", splits.idx+1);
    return splits.idx;
}